

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# codegen.cpp
# Opt level: O0

uint32_t __thiscall CodeGenerator::compute_labels(CodeGenerator *this)

{
  bool bVar1;
  variant<CompiledLabelDef,_CompiledCommand,_CompiledHex> *variant;
  __shared_ptr_access<Label,_(__gnu_cxx::_Lock_policy)2,_false,_false> *this_00;
  element_type *peVar2;
  size_t sVar3;
  CompiledData *op;
  iterator __end1;
  iterator __begin1;
  vector<CompiledData,_std::allocator<CompiledData>_> *__range1;
  CodeGenerator *pCStack_10;
  uint32_t offset;
  CodeGenerator *this_local;
  
  __range1._4_4_ = 0;
  pCStack_10 = this;
  __end1 = std::vector<CompiledData,_std::allocator<CompiledData>_>::begin(&this->compiled);
  op = (CompiledData *)
       std::vector<CompiledData,_std::allocator<CompiledData>_>::end(&this->compiled);
  while( true ) {
    bVar1 = __gnu_cxx::operator!=
                      (&__end1,(__normal_iterator<CompiledData_*,_std::vector<CompiledData,_std::allocator<CompiledData>_>_>
                                *)&op);
    if (!bVar1) break;
    variant = &__gnu_cxx::
               __normal_iterator<CompiledData_*,_std::vector<CompiledData,_std::allocator<CompiledData>_>_>
               ::operator*(&__end1)->data;
    bVar1 = is<CompiledLabelDef,eggs::variants::variant<CompiledLabelDef,CompiledCommand,CompiledHex>>
                      (variant);
    if (bVar1) {
      this_00 = (__shared_ptr_access<Label,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
                eggs::variants::
                get<CompiledLabelDef,CompiledLabelDef,CompiledCommand,CompiledHex,0ul>(variant);
      peVar2 = std::__shared_ptr_access<Label,_(__gnu_cxx::_Lock_policy)2,_false,_false>::operator->
                         (this_00);
      std::experimental::optional<unsigned_int>::operator=
                (&peVar2->code_position,(uint *)((long)&__range1 + 4));
    }
    else {
      sVar3 = ::compiled_size((CompiledData *)variant,this);
      __range1._4_4_ = __range1._4_4_ + (int)sVar3;
    }
    __gnu_cxx::
    __normal_iterator<CompiledData_*,_std::vector<CompiledData,_std::allocator<CompiledData>_>_>::
    operator++(&__end1);
  }
  return __range1._4_4_;
}

Assistant:

uint32_t CodeGenerator::compute_labels()
{
    uint32_t offset = 0;
    for(auto& op : this->compiled)
    {
        if(is<CompiledLabelDef>(op.data))
        {
            get<CompiledLabelDef>(op.data).label->code_position = offset;
        }
        else
        {
            offset += compiled_size(op, *this);
        }
    }
    return offset;
}